

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_decode_str(char **data,uint32_t *len)

{
  char *pcVar1;
  uint32_t uVar2;
  char *str;
  uint32_t *len_local;
  char **data_local;
  
  if (len != (uint32_t *)0x0) {
    uVar2 = mp_decode_strl(data);
    *len = uVar2;
    pcVar1 = *data;
    *data = *data + *len;
    return pcVar1;
  }
  __assert_fail("len != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x821,"const char *mp_decode_str(const char **, uint32_t *)");
}

Assistant:

MP_IMPL const char *
mp_decode_str(const char **data, uint32_t *len)
{
	assert(len != NULL);

	*len = mp_decode_strl(data);
	const char *str = *data;
	*data += *len;
	return str;
}